

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall CUI::RenderTooltip(CUI *this)

{
  long lVar1;
  int iVar2;
  int64 iVar3;
  CUIRect *pCVar4;
  ITextRender *pIVar5;
  CUI *in_RDI;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float Border;
  float Spacing;
  float Rounding;
  CTextBoundingBox BoundingBox;
  CUIRect *pScreen;
  float AlphaFactor;
  float SecondsFadeIn;
  float SecondsSinceActivation;
  float SecondsBeforeFadeIn;
  int64 Now;
  CUIRect Tooltip;
  vec4 OldTextColor;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  CUI *in_stack_ffffffffffffff50;
  CTextCursor *this_00;
  float fVar8;
  anon_union_4_2_94730227_for_vector4_base<float>_1 in_stack_ffffffffffffffb8;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 in_stack_ffffffffffffffbc;
  vec4 *in_stack_ffffffffffffffc0;
  CUIRect *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_pActiveTooltip == (void *)0x0) || (in_RDI->m_aTooltipText[0] == '\0')) {
    RenderTooltip::s_pLastTooltip = (void *)0x0;
  }
  else {
    iVar3 = time_get();
    if (RenderTooltip::s_pLastTooltip != in_RDI->m_pActiveTooltip) {
      RenderTooltip::s_pLastTooltip = in_RDI->m_pActiveTooltip;
      RenderTooltip::s_TooltipActivationStart = iVar3;
    }
    fVar6 = (float)(iVar3 - RenderTooltip::s_TooltipActivationStart);
    iVar3 = time_freq();
    fVar7 = fVar6 / (float)iVar3;
    if (0.75 <= fVar7) {
      if (1.0 <= fVar7) {
        fVar7 = 1.0;
      }
      else {
        fVar7 = (fVar7 - 0.75) / 0.25;
      }
      fVar8 = fVar7;
      pCVar4 = Screen(in_stack_ffffffffffffff50);
      if ((RenderTooltip()::s_Cursor == '\0') &&
         (iVar2 = __cxa_guard_acquire(&RenderTooltip()::s_Cursor), iVar2 != 0)) {
        CTextCursor::CTextCursor((CTextCursor *)in_RDI);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderTooltip::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderTooltip()::s_Cursor);
      }
      this_00 = &RenderTooltip::s_Cursor;
      CTextCursor::Reset(&RenderTooltip::s_Cursor,
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      RenderTooltip::s_Cursor.m_FontSize = 10.0;
      RenderTooltip::s_Cursor.m_MaxLines = -1;
      RenderTooltip::s_Cursor.m_MaxWidth = pCVar4->w * 0.25;
      RenderTooltip::s_Cursor.m_Flags = 10;
      pIVar5 = TextRender(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0xd])();
      pIVar5 = TextRender(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f800000,fVar7);
      pIVar5 = TextRender(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                (pIVar5,this_00,in_RDI->m_aTooltipText,0xffffffff);
      TextRender(in_RDI);
      ITextRender::TextColor
                ((ITextRender *)this_00,
                 (vec4 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      CTextCursor::BoundingBox(this_00);
      MouseX(in_RDI);
      vector4_base<float>::vector4_base
                ((vector4_base<float> *)&stack0xffffffffffffffc8,0.0,0.0,0.0,fVar7 * 0.4);
      CUIRect::Draw(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc.y,
                    (int)in_stack_ffffffffffffffb8);
      CUIRect::Margin((CUIRect *)CONCAT44(fVar6,fVar8),(float)((ulong)this_00 >> 0x20),
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      vector4_base<float>::vector4_base
                ((vector4_base<float> *)&stack0xffffffffffffffb8,0.5,0.5,0.5,fVar7 * 0.8);
      CUIRect::Draw(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc.y,
                    (int)in_stack_ffffffffffffffb8);
      CUIRect::Margin((CUIRect *)CONCAT44(fVar6,fVar8),(float)((ulong)this_00 >> 0x20),
                      (CUIRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      ApplyCursorAlign(in_RDI,(CTextCursor *)CONCAT44(fVar6,fVar8),(CUIRect *)this_00,
                       in_stack_ffffffffffffff4c);
      pIVar5 = TextRender(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
                (0x3f800000,pIVar5,&RenderTooltip::s_Cursor,0,0xffffffff);
      in_RDI->m_pActiveTooltip = (void *)0x0;
      in_RDI->m_aTooltipText[0] = '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::RenderTooltip()
{
	static const void *s_pLastTooltip = 0;
	if(!m_pActiveTooltip || !m_aTooltipText[0])
	{
		s_pLastTooltip = 0;
		return;
	}
	const int64 Now = time_get();
	static int64 s_TooltipActivationStart = 0;
	if(s_pLastTooltip != m_pActiveTooltip)
	{
		// Reset the fade in timer if a new tooltip got active
		s_TooltipActivationStart = Now;
		s_pLastTooltip = m_pActiveTooltip;
	}

	const float SecondsBeforeFadeIn = 0.75f;
	const float SecondsSinceActivation = (Now - s_TooltipActivationStart)/(float)time_freq();
	if(SecondsSinceActivation < SecondsBeforeFadeIn)
		return;
	const float SecondsFadeIn = 0.25f;
	const float AlphaFactor = SecondsSinceActivation < SecondsBeforeFadeIn+SecondsFadeIn ? (SecondsSinceActivation-SecondsBeforeFadeIn)/SecondsFadeIn : 1.0f;
	const CUIRect *pScreen = Screen();

	static CTextCursor s_Cursor;
	s_Cursor.Reset();
	s_Cursor.m_FontSize = 10.0f;
	s_Cursor.m_MaxLines = -1;
	s_Cursor.m_MaxWidth = pScreen->w/4.0f;
	s_Cursor.m_Flags = TEXTFLAG_ALLOW_NEWLINE|TEXTFLAG_WORD_WRAP;
	vec4 OldTextColor = TextRender()->GetColor();
	TextRender()->TextColor(1.0f, 1.0f, 1.0f, AlphaFactor);
	TextRender()->TextDeferred(&s_Cursor, m_aTooltipText, -1);
	TextRender()->TextColor(OldTextColor);

	// Position tooltip below hovered rect, to the right of the mouse cursor.
	// If the tooltip would overflow the screen, position it to the top and/or left instead.
	CTextBoundingBox BoundingBox = s_Cursor.BoundingBox();
	const float Rounding = 4.0f;
	const float Spacing = 4.0f;
	const float Border = 1.0f;
	CUIRect Tooltip = { MouseX(), m_TooltipAnchor.y + m_TooltipAnchor.h + Spacing, BoundingBox.w + 2 * (Spacing+Border), BoundingBox.h + 2 * (Spacing+Border) };
	if(Tooltip.x + Tooltip.w > pScreen->w)
		Tooltip.x -= Tooltip.w;
	if(Tooltip.y + Tooltip.h > pScreen->h)
		Tooltip.y -= Tooltip.h + 2 * Spacing + m_TooltipAnchor.h;
	Tooltip.Draw(vec4(0.0f, 0.0f, 0.0f, 0.4f * AlphaFactor), Rounding);
	Tooltip.Margin(Border, &Tooltip);
	Tooltip.Draw(vec4(0.5f, 0.5f, 0.5f, 0.8f * AlphaFactor), Rounding);
	Tooltip.Margin(Spacing, &Tooltip);
	ApplyCursorAlign(&s_Cursor, &Tooltip, TEXTALIGN_ML);
	TextRender()->DrawTextOutlined(&s_Cursor);

	// Clear active tooltip. DoTooltip must be called each render call.
	m_pActiveTooltip = 0;
	m_aTooltipText[0] = '\0';
}